

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_pattern(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int nr;
  undefined8 uVar14;
  int n_node;
  uint uVar15;
  uint uVar16;
  xmlNodePtr in_RSI;
  undefined8 uVar17;
  int test_ret;
  int iVar18;
  undefined8 *puVar19;
  undefined4 *puVar20;
  int test_ret_3;
  int test_ret_1;
  int local_40;
  int local_3c;
  uint local_38;
  
  if (quiet == '\0') {
    puts("Testing pattern : 10 of 15 functions ...");
  }
  iVar1 = xmlMemBlocks();
  xmlPatternFromRoot(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlPatternFromRoot");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar15 = 0;
  iVar18 = 0;
  do {
    iVar4 = (int)in_RSI;
    iVar3 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(uVar15,iVar4);
    xmlPatternMatch(0,in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar15,in_RSI,nr);
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPatternMatch",(ulong)(uint)(iVar4 - iVar3));
      iVar18 = iVar18 + 1;
      printf(" %d",0);
      in_RSI = (xmlNodePtr)(ulong)uVar15;
      printf(" %d");
      putchar(10);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 3);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlPatternMaxDepth(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlPatternMaxDepth",(ulong)(uint)(iVar5 - iVar3));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlPatternMinDepth(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlPatternMinDepth",(ulong)(uint)(iVar7 - iVar5));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlPatternStreamable(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlPatternStreamable",(ulong)(uint)(iVar9 - iVar7));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = xmlMemBlocks();
  xmlStreamPop(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar10 = xmlMemBlocks();
  if (iVar9 != iVar10) {
    iVar11 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlStreamPop",(ulong)(uint)(iVar11 - iVar9));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar15 = 0;
  do {
    puVar19 = &DAT_00165d70;
    uVar16 = 0;
    do {
      iVar11 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar17 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar17 = 0;
      }
      if (uVar16 < 4) {
        uVar14 = *puVar19;
      }
      else {
        uVar14 = 0;
      }
      xmlStreamPush(0,uVar17,uVar14);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar11 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStreamPush",(ulong)(uint)(iVar12 - iVar11));
        local_3c = local_3c + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
      }
      uVar16 = uVar16 + 1;
      puVar19 = puVar19 + 1;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar15 = 0;
  do {
    puVar19 = &DAT_00165d70;
    uVar16 = 0;
    do {
      iVar12 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar17 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar17 = 0;
      }
      if (uVar16 < 4) {
        uVar14 = *puVar19;
      }
      else {
        uVar14 = 0;
      }
      xmlStreamPushAttr(0,uVar17,uVar14);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar12 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStreamPushAttr",(ulong)(uint)(iVar13 - iVar12));
        iVar11 = iVar11 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
      }
      uVar16 = uVar16 + 1;
      puVar19 = puVar19 + 1;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  local_38 = (uint)(iVar9 != iVar10);
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar15 = 0;
  do {
    uVar16 = 0;
    do {
      iVar9 = 0;
      puVar20 = &DAT_0016343c;
      do {
        iVar10 = xmlMemBlocks();
        if (uVar15 < 4) {
          uVar17 = (&DAT_00165d70)[uVar15];
        }
        else {
          uVar17 = 0;
        }
        if (uVar16 < 4) {
          uVar14 = (&DAT_00165d70)[uVar16];
        }
        else {
          uVar14 = 0;
        }
        xmlStreamPushNode(0,uVar17,uVar14,*puVar20);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar12 = xmlMemBlocks();
        if (iVar10 != iVar12) {
          iVar12 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStreamPushNode",(ulong)(uint)(iVar12 - iVar10));
          local_40 = local_40 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar15);
          printf(" %d",(ulong)uVar16);
          printf(" %d");
          putchar(10);
        }
        iVar9 = iVar9 + 1;
        puVar20 = puVar20 + 1;
      } while (iVar9 != 4);
      uVar16 = uVar16 + 1;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  iVar9 = xmlMemBlocks();
  xmlStreamWantsAnyNode(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar10 = xmlMemBlocks();
  if (iVar9 != iVar10) {
    iVar12 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlStreamWantsAnyNode",(ulong)(uint)(iVar12 - iVar9));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar15 = local_3c + iVar11 +
           iVar18 + (uint)(iVar1 != iVar2) + (uint)(iVar3 != iVar4) + (uint)(iVar5 != iVar6) +
           (uint)(iVar7 != iVar8) + local_38 + local_40 + (uint)(iVar9 != iVar10);
  if (uVar15 != 0) {
    printf("Module pattern: %d errors\n",(ulong)uVar15);
  }
  return uVar15;
}

Assistant:

static int
test_pattern(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing pattern : 10 of 15 functions ...\n");
    test_ret += test_xmlPatternFromRoot();
    test_ret += test_xmlPatternGetStreamCtxt();
    test_ret += test_xmlPatternMatch();
    test_ret += test_xmlPatternMaxDepth();
    test_ret += test_xmlPatternMinDepth();
    test_ret += test_xmlPatternStreamable();
    test_ret += test_xmlPatterncompile();
    test_ret += test_xmlStreamPop();
    test_ret += test_xmlStreamPush();
    test_ret += test_xmlStreamPushAttr();
    test_ret += test_xmlStreamPushNode();
    test_ret += test_xmlStreamWantsAnyNode();

    if (test_ret != 0)
	printf("Module pattern: %d errors\n", test_ret);
    return(test_ret);
}